

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_stdlib.c
# Opt level: O3

void set_signals(sig_t handler)

{
  signal(6,(__sighandler_t)handler);
  signal(4,(__sighandler_t)handler);
  signal(0xb,(__sighandler_t)handler);
  signal(8,(__sighandler_t)handler);
  signal(7,(__sighandler_t)handler);
  signal(0xd,(__sighandler_t)handler);
  return;
}

Assistant:

static inline void set_signals(sig_t handler) {
    signal(SIGABRT, handler);
    signal(SIGILL, handler);
    signal(SIGSEGV, handler);
    signal(SIGFPE, handler);
    signal(SIGBUS, handler);
    signal(SIGPIPE, handler);
}